

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

int Wlc_ObjIsArithm(Wlc_Obj_t *pObj)

{
  undefined1 local_11;
  Wlc_Obj_t *pObj_local;
  
  local_11 = true;
  if ((((((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x6) &&
        (local_11 = true,
        (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x7)) &&
       (local_11 = true,
       (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0xf
       )) && ((local_11 = true,
              (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x18 &&
              (local_11 = true,
              (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x19)))) &&
     ((local_11 = true,
      (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0x2b
      && ((local_11 = true,
          (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x2c &&
          (local_11 = true,
          (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x2d)))))) {
    local_11 = (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x32;
  }
  return (int)local_11;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect arithmetic nodes.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
int Wlc_ObjIsArithm( Wlc_Obj_t * pObj )
{
    return pObj->Type == WLC_OBJ_CONST       || 
           pObj->Type == WLC_OBJ_BUF         || pObj->Type == WLC_OBJ_BIT_NOT     ||
           pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT ||
//           pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_BIT_CONCAT  ||
           pObj->Type == WLC_OBJ_ARI_ADD     || pObj->Type == WLC_OBJ_ARI_SUB     || 
           pObj->Type == WLC_OBJ_ARI_MULTI   || pObj->Type == WLC_OBJ_ARI_MINUS;
}